

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

void __thiscall
crnlib::dxt1_endpoint_optimizer::dxt1_endpoint_optimizer(dxt1_endpoint_optimizer *this)

{
  (this->m_unique_color_hash_map).m_values.m_p = (raw_node *)0x0;
  (this->m_unique_color_hash_map).m_values.m_size = 0;
  (this->m_unique_color_hash_map).m_values.m_capacity = 0;
  this->m_pParams = (params *)0x0;
  this->m_pResults = (results *)0x0;
  this->m_perceptual = false;
  (this->m_unique_color_hash_map).m_hash_shift = 0x20;
  (this->m_norm_unique_colors).m_p = (vec<3U,_float> *)0x0;
  (this->m_norm_unique_colors).m_size = 0;
  (this->m_norm_unique_colors).m_capacity = 0;
  (this->m_norm_unique_colors_weighted).m_p = (vec<3U,_float> *)0x0;
  (this->m_norm_unique_colors_weighted).m_size = 0;
  (this->m_norm_unique_colors_weighted).m_capacity = 0;
  (this->m_unique_color_hash_map).m_num_valid = 0;
  (this->m_unique_color_hash_map).m_grow_threshold = 0;
  (this->m_unique_colors).m_p = (unique_color *)0x0;
  (this->m_unique_colors).m_size = 0;
  (this->m_unique_colors).m_capacity = 0;
  (this->m_evaluated_colors).m_p = (unique_color *)0x0;
  (this->m_evaluated_colors).m_size = 0;
  (this->m_evaluated_colors).m_capacity = 0;
  (this->m_temp_unique_colors).m_p = (unique_color *)0x0;
  (this->m_temp_unique_colors).m_size = 0;
  (this->m_temp_unique_colors).m_capacity = 0;
  (this->m_unique_packed_colors).m_p = (unsigned_short *)0x0;
  (this->m_unique_packed_colors).m_size = 0;
  (this->m_unique_packed_colors).m_capacity = 0;
  (this->m_trial_selectors).m_p = (uchar *)0x0;
  (this->m_trial_selectors).m_size = 0;
  (this->m_trial_selectors).m_capacity = 0;
  (this->m_low_coords).m_p = (vec<3U,_float> *)0x0;
  (this->m_low_coords).m_size = 0;
  (this->m_low_coords).m_capacity = 0;
  (this->m_high_coords).m_p = (vec<3U,_float> *)0x0;
  (this->m_high_coords).m_size = 0;
  (this->m_high_coords).m_capacity = 0;
  this->m_prev_results[0].m_low_color = 0;
  this->m_prev_results[0].m_high_color = 0;
  this->m_prev_results[1].m_low_color = 0;
  this->m_prev_results[1].m_high_color = 0;
  this->m_prev_results[2].m_low_color = 0;
  this->m_prev_results[2].m_high_color = 0;
  this->m_prev_results[3].m_low_color = 0;
  this->m_prev_results[3].m_high_color = 0;
  this->m_num_prev_results = 0;
  (this->m_trial_solution).m_selectors.m_p = (uchar *)0x0;
  (this->m_trial_solution).m_selectors.m_size = 0;
  (this->m_trial_solution).m_selectors.m_capacity = 0;
  (this->m_trial_solution).m_coords.m_low_color = 0;
  (this->m_trial_solution).m_coords.m_high_color = 0;
  (this->m_hi_cells).m_p = (vec<3U,_int> *)0x0;
  (this->m_hi_cells).m_size = 0;
  (this->m_hi_cells).m_capacity = 0;
  (this->m_lo_cells).m_p = (vec<3U,_int> *)0x0;
  (this->m_lo_cells).m_size = 0;
  (this->m_lo_cells).m_capacity = 0;
  (this->m_trial_solution).m_error = 0xffffffffffffffff;
  (this->m_trial_solution).m_alpha_block = false;
  (this->m_best_solution).m_coords.m_low_color = 0;
  (this->m_best_solution).m_coords.m_high_color = 0;
  (this->m_best_solution).m_selectors.m_p = (uchar *)0x0;
  (this->m_best_solution).m_selectors.m_size = 0;
  (this->m_best_solution).m_selectors.m_capacity = 0;
  (this->m_best_solution).m_error = 0xffffffffffffffff;
  (this->m_best_solution).m_alpha_block = false;
  (this->m_solutions_tried).m_values.m_p = (raw_node *)0x0;
  (this->m_solutions_tried).m_values.m_size = 0;
  (this->m_solutions_tried).m_values.m_capacity = 0;
  (this->m_solutions_tried).m_hash_shift = 0x20;
  (this->m_solutions_tried).m_num_valid = 0;
  (this->m_solutions_tried).m_grow_threshold = 0;
  vector<crnlib::vec<3U,_float>_>::reserve(&this->m_low_coords,0x200);
  vector<crnlib::vec<3U,_float>_>::reserve(&this->m_high_coords,0x200);
  vector<crnlib::unique_color>::reserve(&this->m_unique_colors,0x200);
  vector<crnlib::unique_color>::reserve(&this->m_temp_unique_colors,0x200);
  vector<unsigned_short>::reserve(&this->m_unique_packed_colors,0x200);
  vector<crnlib::vec<3U,_float>_>::reserve(&this->m_norm_unique_colors,0x200);
  vector<crnlib::vec<3U,_float>_>::reserve(&this->m_norm_unique_colors_weighted,0x200);
  vector<crnlib::vec<3U,_int>_>::reserve(&this->m_lo_cells,0x80);
  vector<crnlib::vec<3U,_int>_>::reserve(&this->m_hi_cells,0x80);
  return;
}

Assistant:

dxt1_endpoint_optimizer::dxt1_endpoint_optimizer()
    : m_pParams(NULL),
      m_pResults(NULL),
      m_perceptual(false),
      m_num_prev_results(0) {
  m_low_coords.reserve(512);
  m_high_coords.reserve(512);

  m_unique_colors.reserve(512);
  m_temp_unique_colors.reserve(512);
  m_unique_packed_colors.reserve(512);

  m_norm_unique_colors.reserve(512);
  m_norm_unique_colors_weighted.reserve(512);

  m_lo_cells.reserve(128);
  m_hi_cells.reserve(128);
}